

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

int strcmp(char *__s1,char *__s2)

{
  char cVar1;
  char cVar2;
  long lVar3;
  
  cVar1 = *__s1;
  cVar2 = *__s2;
  if (cVar1 == cVar2) {
    lVar3 = 1;
    do {
      if (cVar1 == '\0') {
        return 0;
      }
      cVar1 = __s1[lVar3];
      cVar2 = __s2[lVar3];
      lVar3 = lVar3 + 1;
    } while (cVar1 == cVar2);
  }
  return (int)cVar1 - (int)cVar2;
}

Assistant:

int strcmp(const char *lhs, const char *rhs) {
    for (; *lhs == *rhs; ++lhs, ++rhs) {
        if (*lhs == '\0') {
            return 0;
        }
    }
    const int res = *lhs - *rhs;
    return res;
}